

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O3

pair<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>_>
* __thiscall
jessilib::
split_once<std::vector<signed_char,std::allocator<signed_char>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,signed_char>
          (pair<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
          begin,__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                end,char in_delim)

{
  pointer pcVar1;
  __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  __last;
  allocator_type local_79;
  pointer local_78;
  pointer pcStack_70;
  pointer local_68;
  pointer local_58;
  pointer pcStack_50;
  pointer local_48;
  void *pvStack_40;
  undefined8 local_38;
  long lStack_30;
  pointer local_28;
  pointer pcStack_20;
  
  local_38 = 0;
  lStack_30 = 0;
  local_48 = (pointer)0x0;
  pvStack_40 = (void *)0x0;
  local_58 = (pointer)0x0;
  pcStack_50 = (pointer)0x0;
  __last._M_current = (char *)this;
  if (this < begin._M_current) {
    do {
      if (*__last._M_current == (char)end._M_current) {
        std::vector<signed_char,std::allocator<signed_char>>::
        vector<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,void>
                  ((vector<signed_char,std::allocator<signed_char>> *)&local_78,
                   (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                    )this,__last,&local_79);
        local_58 = local_78;
        pcStack_50 = pcStack_70;
        local_48 = local_68;
        std::vector<signed_char,std::allocator<signed_char>>::
        vector<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,void>
                  ((vector<signed_char,std::allocator<signed_char>> *)&local_78,
                   (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                    )(__last._M_current + 1),begin,&local_79);
        pcVar1 = local_68;
        local_28 = local_78;
        pcStack_20 = pcStack_70;
        local_78 = (pointer)0x0;
        pcStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        if ((pvStack_40 != (void *)0x0) &&
           (operator_delete(pvStack_40,lStack_30 - (long)pvStack_40), local_78 != (pointer)0x0)) {
          operator_delete(local_78,(long)local_68 - (long)local_78);
        }
        (__return_storage_ptr__->first).
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_58;
        (__return_storage_ptr__->first).
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcStack_50;
        (__return_storage_ptr__->first).
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_48;
        (__return_storage_ptr__->second).
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_28;
        (__return_storage_ptr__->second).
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcStack_20;
        (__return_storage_ptr__->second).
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pcVar1;
        return __return_storage_ptr__;
      }
      __last._M_current = __last._M_current + 1;
    } while (__last._M_current != begin._M_current);
    std::vector<signed_char,std::allocator<signed_char>>::
    vector<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,void>
              ((vector<signed_char,std::allocator<signed_char>> *)&local_78,
               (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                )this,begin,&local_79);
    (__return_storage_ptr__->first).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_78;
    (__return_storage_ptr__->first).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcStack_70;
    (__return_storage_ptr__->first).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
    (__return_storage_ptr__->second).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->first).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}